

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O2

char * choc::text::FloatToStringBuffer<float>::writeShortInteger(char *dest,int n)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  long lStack_8;
  
  for (; n < 0; n = -n) {
    *dest = 0x2d;
    dest = (char *)((byte *)dest + 1);
  }
  if ((uint)n < 100) {
    if ((uint)n < 10) {
      lStack_8 = 1;
      pbVar4 = (byte *)dest;
    }
    else {
      uVar1 = (ushort)n & 0xff;
      n = (int)(byte)(uVar1 % 10);
      *dest = (byte)(uVar1 / 10) | 0x30;
      pbVar4 = (byte *)dest + 1;
      lStack_8 = 2;
    }
  }
  else {
    uVar2 = (ulong)(uint)n;
    uVar3 = (ulong)(uint)n;
    n = (uint)n % 10;
    *dest = (char)(uVar2 / 100) + 0x30;
    ((byte *)dest)[1] = (byte)((uVar3 / 10) % 10) | 0x30;
    pbVar4 = (byte *)dest + 2;
    lStack_8 = 3;
  }
  *pbVar4 = (byte)n | 0x30;
  return (char *)((byte *)dest + lStack_8);
}

Assistant:

[[nodiscard]] static char* writeShortInteger (char* dest, int n)
    {
        if (n < 0)    return writeShortInteger (write (dest, '-'), -n);
        if (n >= 100) return writeDigit (dest, n / 100, (n / 10) % 10, n % 10);
        if (n >= 10)  return writeDigit (dest, n / 10,  n % 10);

        return writeDigit (dest, n);
    }